

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O1

void helper_gvec_pmull_q_arm(void *vd,void *vn,void *vm,uint32_t desc)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar11;
  uintptr_t i;
  ulong uVar10;
  
  uVar3 = desc * 8 & 0xff;
  uVar9 = uVar3 + 8;
  uVar10 = (ulong)uVar9;
  uVar11 = 0;
  do {
    lVar7 = uVar11 + (long)((int)desc >> 10);
    uVar4 = *(ulong *)((long)vn + lVar7 * 8);
    uVar1 = *(ulong *)((long)vm + lVar7 * 8);
    uVar5 = -(ulong)((uint)uVar4 & 1) & uVar1;
    uVar6 = 1;
    lVar7 = 0x3f;
    uVar8 = 0;
    do {
      uVar2 = -(ulong)((uVar4 >> (uVar6 & 0x3f) & 1) != 0);
      uVar5 = uVar5 ^ uVar1 << ((byte)uVar6 & 0x3f) & uVar2;
      uVar8 = uVar8 ^ uVar1 >> ((byte)lVar7 & 0x3f) & uVar2;
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
    *(ulong *)((long)vd + uVar11 * 8) = uVar5;
    *(ulong *)((long)vd + uVar11 * 8 + 8) = uVar8;
    uVar11 = uVar11 + 2;
  } while (uVar11 < uVar9 >> 3);
  uVar9 = desc >> 2 & 0xf8;
  if (uVar3 < uVar9) {
    uVar4 = (ulong)(uVar9 + 8);
    uVar11 = uVar10 + 8;
    if (uVar10 + 8 < uVar4) {
      uVar11 = uVar4;
    }
    memset((void *)((long)vd + uVar10),0,(~uVar10 + uVar11 & 0xfffffffffffffff8) + 8);
    return;
  }
  return;
}

Assistant:

void HELPER(gvec_pmull_q)(void *vd, void *vn, void *vm, uint32_t desc)
{
    intptr_t i, j, opr_sz = simd_oprsz(desc);
    intptr_t hi = simd_data(desc);
    uint64_t *d = vd, *n = vn, *m = vm;

    for (i = 0; i < opr_sz / 8; i += 2) {
        uint64_t nn = n[i + hi];
        uint64_t mm = m[i + hi];
        uint64_t rhi = 0;
        uint64_t rlo = 0;

        /* Bit 0 can only influence the low 64-bit result.  */
        if (nn & 1) {
            rlo = mm;
        }

        for (j = 1; j < 64; ++j) {
#ifdef _MSC_VER
            uint64_t mask = 0 - ((nn >> j) & 1);
#else
            uint64_t mask = -((nn >> j) & 1);
#endif
            rlo ^= (mm << j) & mask;
            rhi ^= (mm >> (64 - j)) & mask;
        }
        d[i] = rlo;
        d[i + 1] = rhi;
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}